

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O1

ze_result_t
loader::zetMetricTracerCreateExp
          (zet_context_handle_t hContext,zet_device_handle_t hDevice,uint32_t metricGroupCount,
          zet_metric_group_handle_t *phMetricGroups,zet_metric_tracer_exp_desc_t *desc,
          ze_event_handle_t hNotificationEvent,zet_metric_tracer_exp_handle_t *phMetricTracer)

{
  zet_pfnMetricTracerCreateExp_t p_Var1;
  zet_context_handle_t p_Var2;
  zet_device_handle_t p_Var3;
  ze_result_t zVar4;
  zet_metric_group_handle_t *pp_Var5;
  ulong uVar6;
  object_t<_zet_metric_tracer_exp_handle_t_*> *poVar7;
  ze_event_handle_t p_Var8;
  bool bVar9;
  dditable_t *dditable;
  dditable_t *local_38;
  
  local_38 = *(dditable_t **)(hContext + 8);
  p_Var1 = (local_38->zet).MetricTracerExp.pfnCreateExp;
  if (p_Var1 == (zet_pfnMetricTracerCreateExp_t)0x0) {
    zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    p_Var2 = *(zet_context_handle_t *)hContext;
    p_Var3 = *(zet_device_handle_t *)hDevice;
    pp_Var5 = (zet_metric_group_handle_t *)operator_new__((ulong)metricGroupCount * 8);
    if (metricGroupCount != 0 && phMetricGroups != (zet_metric_group_handle_t *)0x0) {
      uVar6 = 1;
      do {
        pp_Var5[uVar6 - 1] = *(zet_metric_group_handle_t *)phMetricGroups[uVar6 - 1];
        if (phMetricGroups == (zet_metric_group_handle_t *)0x0) break;
        bVar9 = uVar6 < metricGroupCount;
        uVar6 = uVar6 + 1;
      } while (bVar9);
    }
    if (hNotificationEvent == (ze_event_handle_t)0x0) {
      p_Var8 = (ze_event_handle_t)0x0;
    }
    else {
      p_Var8 = *(ze_event_handle_t *)hNotificationEvent;
    }
    zVar4 = (*p_Var1)(p_Var2,p_Var3,metricGroupCount,pp_Var5,desc,p_Var8,phMetricTracer);
    operator_delete__(pp_Var5);
    if (zVar4 == ZE_RESULT_SUCCESS) {
      poVar7 = singleton_factory_t<object_t<_zet_metric_tracer_exp_handle_t*>,_zet_metric_tracer_exp_handle_t*>
               ::getInstance<_zet_metric_tracer_exp_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_tracer_exp_handle_t*>,_zet_metric_tracer_exp_handle_t*>
                           *)(context + 0x13e0),phMetricTracer,&local_38);
      *phMetricTracer = (zet_metric_tracer_exp_handle_t)poVar7;
      zVar4 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar4;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerCreateExp(
        zet_context_handle_t hContext,                  ///< [in] handle of the context object
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        uint32_t metricGroupCount,                      ///< [in] metric group count
        zet_metric_group_handle_t* phMetricGroups,      ///< [in][range(0, metricGroupCount )] handles of the metric groups to
                                                        ///< trace
        zet_metric_tracer_exp_desc_t* desc,             ///< [in,out] metric tracer descriptor
        ze_event_handle_t hNotificationEvent,           ///< [in][optional] event used for report availability notification. Note:
                                                        ///< If buffer is not drained when the event it flagged, there is a risk of
                                                        ///< HW event buffer being overrun
        zet_metric_tracer_exp_handle_t* phMetricTracer  ///< [out] handle of the metric tracer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_context_object_t*>( hContext )->dditable;
        auto pfnCreateExp = dditable->zet.MetricTracerExp.pfnCreateExp;
        if( nullptr == pfnCreateExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hContext = reinterpret_cast<zet_context_object_t*>( hContext )->handle;

        // convert loader handle to driver handle
        hDevice = reinterpret_cast<zet_device_object_t*>( hDevice )->handle;

        // convert loader handles to driver handles
        auto phMetricGroupsLocal = new zet_metric_group_handle_t [metricGroupCount ];
        for( size_t i = 0; ( nullptr != phMetricGroups ) && ( i < metricGroupCount  ); ++i )
            phMetricGroupsLocal[ i ] = reinterpret_cast<zet_metric_group_object_t*>( phMetricGroups[ i ] )->handle;

        // convert loader handle to driver handle
        hNotificationEvent = ( hNotificationEvent ) ? reinterpret_cast<ze_event_object_t*>( hNotificationEvent )->handle : nullptr;

        // forward to device-driver
        result = pfnCreateExp( hContext, hDevice, metricGroupCount, phMetricGroupsLocal, desc, hNotificationEvent, phMetricTracer );
        delete []phMetricGroupsLocal;

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricTracer = reinterpret_cast<zet_metric_tracer_exp_handle_t>(
                context->zet_metric_tracer_exp_factory.getInstance( *phMetricTracer, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }